

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent.cpp
# Opt level: O1

void __thiscall
ear::PolarExtent::PolarExtent
          (PolarExtent *this,shared_ptr<ear::PointSourcePanner> *psp_,
          unique_ptr<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_> *core_impl_)

{
  VectorXd *this_00;
  VectorXd *this_01;
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  size_t sVar4;
  extent_float_t *peVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  undefined8 uVar9;
  Index IVar10;
  Index IVar11;
  uint uVar12;
  Index index;
  extent_float_t *peVar13;
  void *__ptr;
  ulong uVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined8 *puVar15;
  Index size_1;
  char *pcVar16;
  long lVar17;
  double *pdVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  DstEvaluatorType dstEvaluator;
  extent_float_t *peVar22;
  size_t sVar23;
  size_t sVar24;
  float *pfVar25;
  Index size;
  ulong uVar26;
  long lVar27;
  bool bVar28;
  float fVar29;
  double dVar30;
  MatrixXd panning_positions;
  MatrixXd panning_results;
  void *res;
  void *local_138;
  double dStack_130;
  Index local_128;
  VectorXd *local_118;
  double local_110;
  DenseStorage<double,__1,__1,__1,_0> local_108;
  extent_float_t *local_e8;
  VectorXd *local_e0;
  extent_float_t *local_d8;
  double local_d0;
  Vector3d local_c8;
  long lStack_b0;
  void *local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  char local_80 [8];
  void *local_78;
  ulong local_70;
  undefined1 local_68 [24];
  extent_float_t *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  (this->core_impl)._M_t.
  super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>._M_t.
  super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>.
  super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl =
       (core_impl_->_M_t).
       super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>._M_t.
       super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>.
       super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl;
  (core_impl_->_M_t).
  super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>._M_t.
  super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>.
  super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl = (PolarExtentCore *)0x0;
  (this->psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (psp_->super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (psp_->super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  uVar12 = (*((this->psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_vptr_PointSourcePanner[1])();
  this_00 = &this->pvsMin;
  (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
       (double *)0x0;
  (this->pvsMin).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  if (-1 < (int)uVar12) {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)this_00,(ulong)uVar12,(ulong)uVar12,1);
    uVar12 = (*((this->psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_vptr_PointSourcePanner[1])();
    this_01 = &this->pvsMax;
    (this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         (double *)0x0;
    (this->pvsMax).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         0;
    if (-1 < (int)uVar12) {
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                ((DenseStorage<double,__1,__1,_1,_0> *)this_01,(ulong)uVar12,(ulong)uVar12,1);
      peVar13 = (extent_float_t *)malloc(0x128);
      if (((ulong)peVar13 & 0xf) != 0) {
LAB_0014a3e5:
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/util/Memory.h"
                      ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      local_118 = this_00;
      local_e0 = this_01;
      if (peVar13 == (extent_float_t *)0x0) {
        puVar15 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar15 = std::random_device::_M_fini;
        __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      uVar26 = 0;
      do {
        dVar8 = ((double)(long)uVar26 + 1.0) * 5.0 + -90.0;
        auVar7._8_4_ = SUB84(dVar8,0);
        auVar7._0_8_ = ((double)(long)uVar26 + 0.0) * 5.0 + -90.0;
        auVar7._12_4_ = (int)((ulong)dVar8 >> 0x20);
        *(undefined1 (*) [16])(peVar13 + uVar26 * 2) = auVar7;
        bVar28 = uVar26 < 0x22;
        uVar26 = uVar26 + 2;
      } while (bVar28);
      peVar13[0x48] = 0.0;
      peVar13[0x49] = 3.3515625;
      local_138 = (void *)0x0;
      dStack_130 = 0.0;
      local_128 = 3;
      peVar22 = (extent_float_t *)0x0;
      local_68._12_4_ = 0x3ff00000;
      local_68._0_12_ = ZEXT812(0);
      local_e8 = peVar13;
      do {
        local_d0 = *(double *)((long)local_e8 + (long)peVar22);
        dVar8 = cos(local_d0 * 0.017453292519943295);
        dVar8 = (dVar8 * 6.283185307179586) / 6.283185307179586;
        dVar8 = round((dVar8 + dVar8) * 36.0);
        iVar21 = (int)dVar8 + (uint)((int)dVar8 == 0);
        if (iVar21 < -1) {
          __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                        ,0x4a,
                        "Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::linspaced_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                       );
        }
        uVar12 = iVar21 + 1;
        uVar26 = (ulong)(int)uVar12;
        local_d8 = peVar22;
        if (uVar12 == 0) {
          __ptr = (void *)0x0;
        }
        else {
          __ptr = malloc(uVar26 * 8);
          if (((ulong)__ptr & 0xf) != 0) goto LAB_0014a3e5;
          if (__ptr == (void *)0x0) {
            puVar15 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar15 = std::random_device::_M_fini;
            __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
        }
        uVar19 = uVar26 - 1;
        dVar8 = 360.0 / (double)(long)uVar19;
        uVar14 = uVar26 - ((long)uVar26 >> 0x3f) & 0xfffffffffffffffe;
        if (0 < iVar21) {
          lVar17 = 0;
          do {
            dVar30 = ((double)lVar17 + (double)local_68._8_8_) * dVar8 + 0.0;
            if (uVar26 - 2 == lVar17) {
              dVar30 = 360.0;
            }
            auVar6._8_4_ = SUB84(dVar30,0);
            auVar6._0_8_ = ((double)lVar17 + (double)local_68._0_8_) * dVar8 + 0.0;
            auVar6._12_4_ = (int)((ulong)dVar30 >> 0x20);
            *(undefined1 (*) [16])((long)__ptr + lVar17 * 8) = auVar6;
            lVar17 = lVar17 + 2;
          } while (lVar17 < (long)uVar14);
        }
        if ((long)uVar14 < (long)uVar26) {
          do {
            dVar30 = 360.0;
            if (uVar19 != uVar14) {
              dVar30 = (double)(long)uVar14 * dVar8 + 0.0;
            }
            *(double *)((long)__ptr + uVar14 * 8) = dVar30;
            uVar14 = uVar14 + 1;
          } while (uVar26 != uVar14);
        }
        if (0 < iVar21) {
          if ((long)uVar19 < 2) {
            uVar19 = 1;
          }
          uVar26 = 0;
          do {
            if (uVar26 == uVar12) {
              __assert_fail("index >= 0 && index < size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                            ,0x1ab,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                           );
            }
            local_110 = *(double *)((long)__ptr + uVar26 * 8);
            Eigen::internal::
            conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
            ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_138,
                  (long)dStack_130 + 1,local_128);
            cart(&local_c8,local_110,local_d0,1.0);
            if (local_128 < 0 && local_138 != (void *)0x0) {
              pcVar16 = 
              "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
              ;
              goto LAB_0014a35f;
            }
            if ((long)dStack_130 < 1) {
              pcVar16 = 
              "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
              ;
              goto LAB_0014a39d;
            }
            if (local_128 != 3) {
              pcVar16 = 
              "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>]"
              ;
              goto LAB_0014a340;
            }
            pdVar18 = (double *)((long)local_138 + (long)dStack_130 * 8 + -8);
            lVar17 = 0;
            do {
              *pdVar18 = local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[lVar17];
              lVar17 = lVar17 + 1;
              pdVar18 = pdVar18 + (long)dStack_130;
            } while (lVar17 != 3);
            uVar26 = uVar26 + 1;
          } while (uVar26 != uVar19);
        }
        free(__ptr);
        peVar22 = local_d8 + 2;
      } while (peVar22 != (extent_float_t *)0x128);
      free(local_e8);
      local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = 0.0;
      lStack_b0 = 0;
      local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = 0.0;
      local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = 0.0;
      local_a0 = (void *)0x0;
      uStack_98 = 0;
      local_90 = 0;
      Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
      construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_c8
                 ,&local_138);
      iVar21 = (*((this->psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->_vptr_PointSourcePanner[1])();
      local_108.m_data = (double *)0x0;
      local_108.m_rows = 0;
      local_108.m_cols = 0;
      uVar26 = (ulong)iVar21;
      if ((long)((ulong)local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[1] | uVar26) < 0) {
        pcVar16 = 
        "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
        ;
LAB_0014a4ce:
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                      ,0x115,pcVar16);
      }
      if ((local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] != 0.0 && iVar21 != 0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
                 SEXT816((long)local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                               .m_storage.m_data.array[1]),0) < (long)uVar26)) {
        puVar15 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar15 = std::random_device::_M_fini;
        __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                (&local_108,
                 (long)local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[1] * uVar26,uVar26,
                 (Index)local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[1]);
      if (0 < (long)local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[1]) {
        lVar27 = 0;
        lVar17 = 0;
        do {
          if ((long)local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[2] < 0 &&
              (extent_float_t *)
              local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[0] != (extent_float_t *)0x0) {
            pcVar16 = 
            "Eigen::MapBase<Eigen::Block<const Eigen::Ref<const Eigen::Matrix<double, -1, -1>>, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Ref<const Eigen::Matrix<double, -1, -1>>, 1>, Level = 0]"
            ;
            goto LAB_0014a35f;
          }
          if (local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[2] != 1.48219693752374e-323) {
            pcVar16 = 
            "void Eigen::PlainObjectBase<Eigen::Matrix<double, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 3, 1>]"
            ;
            goto LAB_0014a4ce;
          }
          peVar3 = (this->psp).
                   super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar13 = (extent_float_t *)
                    ((long)local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[0] + lVar17 * 2 * 4);
          local_48 = *(undefined8 *)peVar13;
          local_40 = *(undefined8 *)(peVar13 + lStack_b0 * 2);
          local_38 = *(undefined8 *)(peVar13 + lStack_b0 * 4);
          (**peVar3->_vptr_PointSourcePanner)(local_80,peVar3,&local_48);
          if (local_80[0] == '\0') {
            __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bc,
                          "reference_type boost::optional<Eigen::Matrix<double, -1, 1>>::get() [T = Eigen::Matrix<double, -1, 1>]"
                         );
          }
          if (local_108.m_rows < 0 && local_108.m_data != (double *)0x0) {
            pcVar16 = 
            "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
            ;
LAB_0014a35f:
            __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                          ,0xb2,pcVar16);
          }
          if (local_108.m_cols <= lVar17) {
            pcVar16 = 
            "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
            ;
LAB_0014a39d:
            __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                          ,0x7a,pcVar16);
          }
          if (local_108.m_rows != local_70) {
            pcVar16 = 
            "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>]"
            ;
LAB_0014a340:
            __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow to resize.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseBase.h"
                          ,0x106,pcVar16);
          }
          uVar26 = local_108.m_rows;
          if ((((ulong)(local_108.m_data + local_108.m_rows * lVar17) & 7) == 0) &&
             (uVar26 = (ulong)((uint)((ulong)(local_108.m_data + local_108.m_rows * lVar17) >> 3) &
                              1), local_108.m_rows <= (long)uVar26)) {
            uVar26 = local_108.m_rows;
          }
          if (0 < (long)uVar26) {
            uVar19 = 0;
            do {
              *(undefined8 *)((long)local_108.m_data + uVar19 * 8 + local_108.m_rows * lVar27) =
                   *(undefined8 *)((long)local_78 + uVar19 * 8);
              uVar19 = uVar19 + 1;
            } while (uVar26 != uVar19);
          }
          lVar20 = local_108.m_rows - uVar26;
          uVar19 = (lVar20 - (lVar20 >> 0x3f) & 0xfffffffffffffffeU) + uVar26;
          if (1 < lVar20) {
            do {
              puVar15 = (undefined8 *)((long)local_78 + uVar26 * 8);
              uVar9 = puVar15[1];
              puVar1 = (undefined8 *)
                       ((long)local_108.m_data + uVar26 * 8 + local_108.m_rows * lVar27);
              *puVar1 = *puVar15;
              puVar1[1] = uVar9;
              uVar26 = uVar26 + 2;
            } while ((long)uVar26 < (long)uVar19);
          }
          if ((long)uVar19 < local_108.m_rows) {
            do {
              *(undefined8 *)((long)local_108.m_data + uVar19 * 8 + local_108.m_rows * lVar27) =
                   *(undefined8 *)((long)local_78 + uVar19 * 8);
              uVar19 = uVar19 + 1;
            } while (local_108.m_rows != uVar19);
          }
          if (local_80[0] == '\x01') {
            free(local_78);
            local_80[0] = '\0';
          }
          lVar17 = lVar17 + 1;
          lVar27 = lVar27 + 8;
        } while (lVar17 < (long)local_c8.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[1]);
      }
      free(local_a0);
      IVar11 = local_108.m_cols;
      IVar10 = local_108.m_rows;
      iVar21 = (*((this->core_impl)._M_t.
                  super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>
                  .super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl)->
                 _vptr_PolarExtentCore[3])();
      uVar26 = CONCAT44(extraout_var,iVar21);
      (this->ctx).real_num_speakers = IVar10;
      uVar19 = (uVar26 + IVar10) - 1;
      (this->ctx).num_speakers = uVar19 - uVar19 % uVar26;
      local_110 = (double)IVar11;
      uVar14 = (uVar26 + IVar11) - 1;
      sVar23 = uVar14 - uVar14 % uVar26;
      (this->ctx).num_points = sVar23;
      iVar21 = (*((this->core_impl)._M_t.
                  super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>
                  .super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl)->
                 _vptr_PolarExtentCore[2])();
      uVar19 = CONCAT44(extraout_var_00,iVar21);
      if ((uVar19 & uVar19 - 1) == 0) {
        if (7 < uVar19) {
          sVar24 = sVar23 * 4;
          local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = 0.0;
          iVar21 = posix_memalign((void **)&local_c8,uVar19,sVar24);
          if (iVar21 != 0) {
            local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] = 0.0;
          }
          dVar8 = local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0];
          if (uVar14 != uVar14 % uVar26) {
            memset((void *)local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[0],0,sVar24);
          }
          (this->ctx).xs = (extent_float_t *)dVar8;
          sVar23 = (this->ctx).num_points;
          iVar21 = (*((this->core_impl)._M_t.
                      super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>
                      .super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl)->
                     _vptr_PolarExtentCore[2])();
          uVar19 = CONCAT44(extraout_var_01,iVar21);
          if ((uVar19 & uVar19 - 1) != 0) goto LAB_0014a4d8;
          if (7 < uVar19) {
            sVar24 = sVar23 * 4;
            local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] = 0.0;
            iVar21 = posix_memalign((void **)&local_c8,uVar19,sVar24);
            if (iVar21 != 0) {
              local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[0] = 0.0;
            }
            dVar8 = local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[0];
            if (sVar23 != 0) {
              memset((void *)local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array[0],0,sVar24);
            }
            (this->ctx).ys = (extent_float_t *)dVar8;
            sVar23 = (this->ctx).num_points;
            iVar21 = (*((this->core_impl)._M_t.
                        super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>
                        .super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl)->
                       _vptr_PolarExtentCore[2])();
            uVar19 = CONCAT44(extraout_var_02,iVar21);
            if ((uVar19 & uVar19 - 1) != 0) goto LAB_0014a4d8;
            if (7 < uVar19) {
              sVar24 = sVar23 * 4;
              local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[0] = 0.0;
              iVar21 = posix_memalign((void **)&local_c8,uVar19,sVar24);
              if (iVar21 != 0) {
                local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0] = 0.0;
              }
              dVar8 = local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[0];
              if (sVar23 != 0) {
                memset((void *)local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                               .m_storage.m_data.array[0],0,sVar24);
              }
              (this->ctx).zs = (extent_float_t *)dVar8;
              lVar17 = (this->ctx).num_speakers * (this->ctx).num_points;
              iVar21 = (*((this->core_impl)._M_t.
                          super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>
                          .super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl)->
                         _vptr_PolarExtentCore[2])();
              uVar19 = CONCAT44(extraout_var_03,iVar21);
              if ((uVar19 & uVar19 - 1) != 0) goto LAB_0014a4d8;
              if (7 < uVar19) {
                sVar24 = lVar17 * 4;
                local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0] = 0.0;
                iVar21 = posix_memalign((void **)&local_c8,uVar19,sVar24);
                if (iVar21 != 0) {
                  local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0] = 0.0;
                }
                dVar8 = local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[0];
                if (lVar17 != 0) {
                  memset((void *)local_c8.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[0],0,sVar24);
                }
                (this->ctx).panning_results = (extent_float_t *)dVar8;
                lVar17 = ((this->ctx).num_points / uVar26) * (this->ctx).num_speakers;
                iVar21 = (*((this->core_impl)._M_t.
                            super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>
                            .super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl)->
                           _vptr_PolarExtentCore[2])();
                uVar19 = CONCAT44(extraout_var_04,iVar21);
                if ((uVar19 & uVar19 - 1) != 0) goto LAB_0014a4d8;
                if (7 < uVar19) {
                  sVar24 = lVar17 * 4;
                  local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0] = 0.0;
                  iVar21 = posix_memalign((void **)&local_c8,uVar19,sVar24);
                  if (iVar21 != 0) {
                    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[0] = 0.0;
                  }
                  dVar8 = local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[0];
                  if (lVar17 != 0) {
                    memset((void *)local_c8.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[0],0,sVar24);
                  }
                  (this->ctx).summed_panning_results = (extent_float_t *)dVar8;
                  sVar23 = (this->ctx).num_speakers;
                  iVar21 = (*((this->core_impl)._M_t.
                              super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>
                              .super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl)->
                             _vptr_PolarExtentCore[2])();
                  uVar19 = CONCAT44(extraout_var_05,iVar21);
                  if ((uVar19 & uVar19 - 1) != 0) goto LAB_0014a4d8;
                  if (7 < uVar19) {
                    sVar24 = sVar23 * 4;
                    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[0] = 0.0;
                    iVar21 = posix_memalign((void **)&local_c8,uVar19,sVar24);
                    if (iVar21 != 0) {
                      local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[0] = 0.0;
                    }
                    dVar8 = local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                            m_storage.m_data.array[0];
                    if (sVar23 != 0) {
                      memset((void *)local_c8.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                     m_storage.m_data.array[0],0,sVar24);
                    }
                    (this->ctx).results = (extent_float_t *)dVar8;
                    if (local_110 != 0.0) {
                      local_d8 = (this->ctx).xs;
                      local_e8 = (this->ctx).ys;
                      local_118 = (VectorXd *)((long)local_138 + (long)dStack_130 * 8);
                      local_d0 = dStack_130;
                      local_68._0_8_ = local_138;
                      local_e0 = (VectorXd *)((long)dStack_130 * 0x10 + (long)local_138);
                      local_50 = (this->ctx).zs;
                      lVar27 = 0;
                      lVar17 = 0;
                      uVar19 = 0;
                      do {
                        if (((((long)dStack_130 <= (long)uVar19) || (local_128 < 1)) ||
                            (local_d8[uVar19] = (float)*(double *)((long)local_138 + uVar19 * 8),
                            local_128 == 1)) ||
                           (local_e8[uVar19] =
                                 (float)(double)(&(local_118->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data)[uVar19], local_128 < 3))
                        goto LAB_0014a3a7;
                        local_50[uVar19] =
                             (float)(double)(&(local_e0->
                                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                              ).m_storage.m_data)[uVar19];
                        if (IVar10 != 0) {
                          peVar13 = (this->ctx).summed_panning_results;
                          sVar23 = (this->ctx).num_points;
                          sVar4 = (this->ctx).num_speakers;
                          pfVar25 = (float *)((long)(this->ctx).panning_results + lVar17);
                          uVar14 = 0;
                          do {
                            if ((local_108.m_rows <= (long)uVar14) ||
                               (local_108.m_cols <= (long)uVar19)) goto LAB_0014a3a7;
                            fVar29 = (float)*(double *)
                                             ((long)local_108.m_data +
                                             uVar14 * 8 + local_108.m_rows * lVar27);
                            *pfVar25 = fVar29;
                            lVar20 = (uVar19 / uVar26) * sVar4;
                            peVar13[lVar20 + uVar14] = fVar29 + peVar13[lVar20 + uVar14];
                            uVar14 = uVar14 + 1;
                            pfVar25 = pfVar25 + sVar23;
                          } while (IVar10 != uVar14);
                        }
                        uVar19 = uVar19 + 1;
                        lVar17 = lVar17 + 4;
                        lVar27 = lVar27 + 8;
                      } while ((double)uVar19 != local_110);
                    }
                    uVar26 = (this->ctx).num_points;
                    if ((ulong)local_110 < uVar26) {
                      if ((((long)((long)local_110 - 1U) < 0) ||
                          ((long)dStack_130 <= (long)((long)local_110 - 1U))) || (local_128 < 1)) {
LAB_0014a3a7:
                        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                                      ,0x16f,
                                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                                     );
                      }
                      peVar13 = (this->ctx).xs;
                      peVar22 = (this->ctx).ys;
                      peVar5 = (this->ctx).zs;
                      dVar8 = *(double *)((long)local_138 + (long)local_110 * 8 + -8);
                      dVar30 = local_110;
                      do {
                        peVar13[(long)dVar30] = (float)dVar8;
                        if ((local_128 == 1) ||
                           (peVar22[(long)dVar30] =
                                 (float)*(double *)
                                         ((long)local_138 +
                                         (long)local_110 * 8 + (long)dStack_130 * 8 + -8),
                           local_128 < 3)) goto LAB_0014a3a7;
                        peVar5[(long)dVar30] =
                             (float)*(double *)
                                     ((long)local_138 +
                                     (long)local_110 * 8 + (long)dStack_130 * 0x10 + -8);
                        dVar30 = (double)((long)dVar30 + 1);
                      } while ((double)uVar26 != dVar30);
                    }
                    free(local_108.m_data);
                    free(local_138);
                    return;
                  }
                }
              }
            }
          }
        }
        __assert_fail("(alignment >= sizeof(void*)) && \"alignment must be at least the size of a pointer\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/xsimd/include/xsimd/memory/xsimd_aligned_allocator.hpp"
                      ,0x11b,"void *xsimd::detail::xaligned_malloc(size_t, size_t)");
      }
LAB_0014a4d8:
      __assert_fail("((alignment & (alignment - 1)) == 0) && \"alignment must be a power of two\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/xsimd/include/xsimd/memory/xsimd_aligned_allocator.hpp"
                    ,0x11a,"void *xsimd::detail::xaligned_malloc(size_t, size_t)");
    }
  }
  __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                ,0x130,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

PolarExtent::PolarExtent(const std::shared_ptr<PointSourcePanner> &psp_,
                           std::unique_ptr<PolarExtentCore> core_impl_)
      : core_impl(std::move(core_impl_)),
        psp(psp_),
        pvsMin(psp->numberOfOutputChannels()),
        pvsMax(psp->numberOfOutputChannels()) {
    auto panning_positions = generatePanningPositionsEven(nRows);
    auto panning_results =
        generatePanningPositionsResults(psp, panning_positions);

    size_t num_speakers = panning_results.rows();
    size_t num_points = panning_results.cols();
    size_t batch_size = core_impl->batch_size();
    ctx.real_num_speakers = num_speakers;
    ctx.num_speakers = round_up(num_speakers, batch_size);
    ctx.num_points = round_up(num_points, batch_size);

    // use regular malloc and free for memory management. reasoning:
    // - the parts compiled with different architectures should not use any
    //   in-line functions which could get merged; therefore using any kind of
    //   smart pointer in the interface is a bad plan
    // - we could use a smart pointer and extract a float pointer, but that
    //   doesn't make it much cleaner, would still break copying, and would
    //   ultimately be more code
    // - using smart pointers would be awkward anyway, as the alignment is
    //   known at run-time
    auto malloc_float = [&](size_t n) {
      auto mem = (extent_float_t *)xsimd::aligned_malloc(
          sizeof(extent_float_t) * n, core_impl->alignment());
      for (size_t i = 0; i < n; i++) mem[i] = 0.0;
      return mem;
    };

    ctx.xs = malloc_float(ctx.num_points);
    ctx.ys = malloc_float(ctx.num_points);
    ctx.zs = malloc_float(ctx.num_points);

    ctx.panning_results = malloc_float(ctx.num_points * ctx.num_speakers);
    size_t num_batches = ctx.num_points / batch_size;
    ctx.summed_panning_results = malloc_float(num_batches * ctx.num_speakers);

    ctx.results = malloc_float(ctx.num_speakers);

    for (size_t p = 0; p < num_points; p++) {
      ctx.xs[p] = static_cast<extent_float_t>(panning_positions(p, 0));
      ctx.ys[p] = static_cast<extent_float_t>(panning_positions(p, 1));
      ctx.zs[p] = static_cast<extent_float_t>(panning_positions(p, 2));

      for (size_t s = 0; s < num_speakers; s++) {
        ctx.panning_results[s * ctx.num_points + p] =
            static_cast<extent_float_t>(panning_results(s, p));
        size_t batch = p / batch_size;
        ctx.summed_panning_results[batch * ctx.num_speakers + s] +=
            static_cast<extent_float_t>(panning_results(s, p));
      }
    }

    for (size_t p = num_points; p < ctx.num_points; p++) {
      // the results of these will be ignored; make them consistent with the
      // rest of the batch
      ctx.xs[p] =
          static_cast<extent_float_t>(panning_positions(num_points - 1, 0));
      ctx.ys[p] =
          static_cast<extent_float_t>(panning_positions(num_points - 1, 1));
      ctx.zs[p] =
          static_cast<extent_float_t>(panning_positions(num_points - 1, 2));
    }
  }